

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_math.c
# Opt level: O0

int jpc_int_firstone(int x)

{
  int local_10;
  int local_c;
  int n;
  int x_local;
  
  if (-1 < x) {
    local_10 = -1;
    for (local_c = x; 0 < local_c; local_c = local_c >> 1) {
      local_10 = local_10 + 1;
    }
    return local_10;
  }
  __assert_fail("x >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_math.c"
                ,0x6c,"int jpc_int_firstone(int)");
}

Assistant:

int jpc_int_firstone(int x)
{
	int n;

	/* The argument must be nonnegative. */
	assert(x >= 0);

	n = -1;
	while (x > 0) {
		x >>= 1;
		++n;
	}
	return n;
}